

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>const,_1,1,false>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,_1,_1,false>,1>,Eigen::internal::assign_op<float,float>>
               (Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
               *src,assign_op<float,_float> *func)

{
  long lVar1;
  RhsNested *pRVar2;
  type *ptVar3;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
  m_outerStride =
       (src->m_lhs).m_matrix.
       super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
       m_outerStride;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>.m_data =
       (src->m_lhs).m_matrix.
       super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>.
       m_data;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>.m_rows.
  m_value = (src->m_lhs).m_matrix.
            super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
            .m_rows.m_value;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>._16_8_ =
       *(undefined8 *)
        &(src->m_lhs).m_matrix.
         super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>.
         field_0x10;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.m_xpr =
       (src->m_lhs).m_matrix.
       super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.m_xpr;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.m_startRow.
  m_value = (src->m_lhs).m_matrix.
            super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
            m_startRow.m_value;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.m_startCol.
  m_value = (src->m_lhs).m_matrix.
            super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
            m_startCol.m_value;
  pRVar2 = &src->m_rhs;
  ptVar3 = &srcEvaluator.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
            .m_rhs;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    (ptVar3->
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_data = (pRVar2->
              super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
              ).
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
              .m_data;
    pRVar2 = (RhsNested *)
             &(pRVar2->
              super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
              ).
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
              .m_rows;
    ptVar3 = (type *)&(ptVar3->
                      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                      ).
                      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
                      .m_rows;
  }
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhsImpl.
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
  .m_argImpl.
  super_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>.
  super_block_evaluator<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value =
       ((srcEvaluator.
         super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
         .m_lhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
        m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>).m_storage.m_rows;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhsImpl.
  super_block_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>
  .m_data = srcEvaluator.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
            .m_rhs.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
            .m_data;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhsImpl.
  super_block_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>
  .m_outerStride.m_value =
       ((srcEvaluator.
         super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
         .m_rhs.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false,_true>
         .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.m_xpr)->
       super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_innerDim = (src->m_lhs).m_matrix.
                super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
                .m_rows.m_value;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhsImpl.
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
  .m_argImpl.
  super_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>.
  super_block_evaluator<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_data = srcEvaluator.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
            .m_lhs.m_matrix.
            super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>,_0>
            .m_data;
  resize_if_allowed<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>const,_1,1,false>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,_1,_1,false>,1>,float,float>
            (dst,src,func);
  dstEvaluator.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,_1>_>
  .m_data = (dst->
            super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
            ).
            super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data;
  kernel.m_dst = &dstEvaluator;
  dstEvaluator.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,_1>_>
  .m_outerStride.m_value =
       (dst->
       super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>).
       super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
       m_cols.m_value;
  kernel.m_src = &srcEvaluator;
  kernel.m_functor = func;
  kernel.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_0>
  ::run(&kernel);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}